

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::TensorValue::set_allocated_ints
          (TensorValue *this,TensorValue_RepeatedInts *ints)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_value(this);
  if (ints != (TensorValue_RepeatedInts *)0x0) {
    submessage_arena = (Arena *)(ints->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 2) == 0) {
      if (((ulong)submessage_arena & 1) != 0) {
        submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffc);
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      ints = (TensorValue_RepeatedInts *)
             google::protobuf::internal::GetOwnedMessageInternal
                       (message_arena,&ints->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 2;
    (this->value_).ints_ = ints;
  }
  return;
}

Assistant:

void TensorValue::set_allocated_ints(::CoreML::Specification::MILSpec::TensorValue_RepeatedInts* ints) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (ints) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TensorValue_RepeatedInts>::GetOwningArena(ints);
    if (message_arena != submessage_arena) {
      ints = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, ints, submessage_arena);
    }
    set_has_ints();
    value_.ints_ = ints;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.TensorValue.ints)
}